

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

void nghttp2_bufs_reset(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_bufs *pnVar2;
  size_t sVar3;
  uint8_t *puVar4;
  nghttp2_buf_chain *chain;
  
  sVar3 = bufs->chunk_keep;
  pnVar2 = bufs;
  do {
    pnVar2 = (nghttp2_bufs *)pnVar2->head;
    if (pnVar2 == (nghttp2_bufs *)0x0) goto LAB_005060c6;
    puVar4 = ((nghttp2_buf *)&pnVar2->cur)->begin;
    pnVar2->chunk_used = (size_t)puVar4;
    puVar4 = puVar4 + bufs->offset;
    pnVar2->chunk_length = (size_t)puVar4;
    pnVar2->max_chunk = (size_t)puVar4;
    sVar3 = sVar3 - 1;
  } while (sVar3 != 0);
  chain = pnVar2->head;
  pnVar2->head = (nghttp2_buf_chain *)0x0;
  while (chain != (nghttp2_buf_chain *)0x0) {
    pnVar1 = chain->next;
    buf_chain_del(chain,bufs->mem);
    chain = pnVar1;
  }
  bufs->chunk_used = bufs->chunk_keep;
LAB_005060c6:
  bufs->cur = bufs->head;
  return;
}

Assistant:

void nghttp2_bufs_reset(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *chain, *ci;
  size_t k;

  k = bufs->chunk_keep;

  for (ci = bufs->head; ci; ci = ci->next) {
    nghttp2_buf_reset(&ci->buf);
    nghttp2_buf_shift_right(&ci->buf, bufs->offset);

    if (--k == 0) {
      break;
    }
  }

  if (ci) {
    chain = ci->next;
    ci->next = NULL;

    for (ci = chain; ci;) {
      chain = ci->next;

      buf_chain_del(ci, bufs->mem);

      ci = chain;
    }

    bufs->chunk_used = bufs->chunk_keep;
  }

  bufs->cur = bufs->head;
}